

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlStreamPushAttr(void)

{
  int iVar1;
  int iVar2;
  xmlChar *val;
  xmlChar *val_00;
  uint local_44;
  int n_ns;
  xmlChar *ns;
  int n_name;
  xmlChar *name;
  int n_stream;
  xmlStreamCtxtPtr stream;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (name._4_4_ = 0; (int)name._4_4_ < 1; name._4_4_ = name._4_4_ + 1) {
    for (ns._4_4_ = 0; (int)ns._4_4_ < 5; ns._4_4_ = ns._4_4_ + 1) {
      for (local_44 = 0; (int)local_44 < 5; local_44 = local_44 + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_const_xmlChar_ptr(ns._4_4_,1);
        val_00 = gen_const_xmlChar_ptr(local_44,2);
        iVar2 = xmlStreamPushAttr(0,val,val_00);
        desret_int(iVar2);
        call_tests = call_tests + 1;
        des_const_xmlChar_ptr(ns._4_4_,val,1);
        des_const_xmlChar_ptr(local_44,val_00,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlStreamPushAttr",(ulong)(uint)(iVar2 - iVar1));
          ret_val = ret_val + 1;
          printf(" %d",(ulong)name._4_4_);
          printf(" %d",(ulong)ns._4_4_);
          printf(" %d",(ulong)local_44);
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlStreamPushAttr(void) {
    int test_ret = 0;

#if defined(LIBXML_PATTERN_ENABLED)
    int mem_base;
    int ret_val;
    xmlStreamCtxtPtr stream; /* the stream context */
    int n_stream;
    const xmlChar * name; /* the current name */
    int n_name;
    const xmlChar * ns; /* the namespace name */
    int n_ns;

    for (n_stream = 0;n_stream < gen_nb_xmlStreamCtxtPtr;n_stream++) {
    for (n_name = 0;n_name < gen_nb_const_xmlChar_ptr;n_name++) {
    for (n_ns = 0;n_ns < gen_nb_const_xmlChar_ptr;n_ns++) {
        mem_base = xmlMemBlocks();
        stream = gen_xmlStreamCtxtPtr(n_stream, 0);
        name = gen_const_xmlChar_ptr(n_name, 1);
        ns = gen_const_xmlChar_ptr(n_ns, 2);

        ret_val = xmlStreamPushAttr(stream, name, ns);
        desret_int(ret_val);
        call_tests++;
        des_xmlStreamCtxtPtr(n_stream, stream, 0);
        des_const_xmlChar_ptr(n_name, name, 1);
        des_const_xmlChar_ptr(n_ns, ns, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlStreamPushAttr",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_stream);
            printf(" %d", n_name);
            printf(" %d", n_ns);
            printf("\n");
        }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}